

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isojoliet_versioned.c
# Opt level: O0

void test_read_format_isojoliet_versioned(void)

{
  archive *paVar1;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  archive *a;
  archive_entry *ae;
  char *refname;
  wchar_t in_stack_00000028;
  char *in_stack_000003f0;
  archive *in_stack_ffffffffffffffd8;
  archive *paVar2;
  char *v;
  archive_entry **ppaVar3;
  archive_entry *paVar4;
  int n;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  char *file;
  
  file = "test_read_format_iso_joliet_by_nero.iso.Z";
  extract_reference_file(in_stack_000003f0);
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  archive_read_support_filter_all(in_stack_ffffffffffffffd8);
  paVar2 = (archive *)0x0;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1809c5,a);
  archive_read_support_format_all(paVar2);
  v = (char *)0x0;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1809fd,a);
  archive_read_set_option
            ((archive *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),(char *)paVar1
             ,(char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),v);
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x180a47,a);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),(char *)paVar1
             ,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x180a89,a);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),ppaVar3);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x180ac6,a);
  archive_entry_pathname(paVar4);
  uVar5 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,file,
             (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),(char *)paVar1,
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),refname,in_stack_00000028);
  archive_entry_filetype
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180b4a,a);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),ppaVar3);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180b87,a);
  archive_entry_pathname(paVar4);
  uVar5 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,file,
             (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),(char *)paVar1,
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),refname,in_stack_00000028);
  archive_entry_filetype
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180c0b,a);
  archive_entry_is_encrypted
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180c44,a);
  archive_read_has_encrypted_entries(paVar1);
  paVar2 = paVar1;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar1,
                      (char *)0x180c80,a);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(archive_entry **)paVar1);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar2,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180cbd,a);
  archive_entry_pathname(paVar4);
  uVar5 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,file,
             (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),(char *)paVar2,
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),refname,in_stack_00000028);
  archive_entry_filetype
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar2,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180d41,a);
  archive_entry_is_encrypted
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar2,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180d7a,a);
  archive_read_has_encrypted_entries(paVar2);
  paVar1 = paVar2;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar2,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar2,
                      (char *)0x180db6,a);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(archive_entry **)paVar2);
  n = 0;
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180df6,a);
  archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),n);
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180e34,a);
  archive_read_close((archive *)0x180e3e);
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar1,
                      (char *)0x180e6d,a);
  archive_read_free((archive *)0x180e77);
  assertion_equal_int(file,in_stack_fffffffffffffff4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x180ea5,a);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isojoliet_versioned)
{
	const char *refname = "test_read_format_iso_joliet_by_nero.iso.Z";
	struct archive_entry *ae;
	struct archive *a;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_set_option(a, "iso9660", "rockridge", NULL));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* First entry is '.' root directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));

	/* A directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("test", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A regular file which is called test.txt and has
	 * ;1 appended to it because apparently Nero always
	 * appends versions to all files in the joliet extension.
	 *
	 * We test to make sure the version has been stripped.
	 */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("test/test.txt",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}